

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Lodtalk::ASTInterpreter::ASTInterpreter
          (ASTInterpreter *this,InterpreterProxy *interpreter,EvaluationScopePtr *initialScope,
          Oop currentSelf)

{
  VMContext *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  ScopedInterpreter::ScopedInterpreter
            (&this->super_ScopedInterpreter,(VMContext *)CONCAT44(extraout_var,iVar2),initialScope);
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_001707d0;
  this->interpreter = interpreter;
  pVVar1 = (this->super_ScopedInterpreter).context;
  (this->currentSelf).oop.field_0 = currentSelf.field_0;
  (this->currentSelf).context_ = pVVar1;
  OopRef::registerSelf(&this->currentSelf);
  return;
}

Assistant:

ASTInterpreter(InterpreterProxy *interpreter, const EvaluationScopePtr &initialScope, Oop currentSelf)
		: ScopedInterpreter(interpreter->getContext(), initialScope), interpreter(interpreter), currentSelf(context, currentSelf) {}